

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O2

void tcg_gen_abs_i64_x86_64(TCGContext *tcg_ctx,TCGv_i64 ret,TCGv_i64 a)

{
  TCGv_i64 ret_00;
  uintptr_t o;
  
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_sari_i64_x86_64(tcg_ctx,ret_00,a,0x3f);
  tcg_gen_xor_i64_x86_64(tcg_ctx,ret,a,ret_00);
  tcg_gen_sub_i64(tcg_ctx,ret,ret,ret_00);
  tcg_temp_free_internal_x86_64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  return;
}

Assistant:

void tcg_gen_abs_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 a)
{
    TCGv_i64 t = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_sari_i64(tcg_ctx, t, a, 63);
    tcg_gen_xor_i64(tcg_ctx, ret, a, t);
    tcg_gen_sub_i64(tcg_ctx, ret, ret, t);
    tcg_temp_free_i64(tcg_ctx, t);
}